

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void in_memory_snapshot_cleanup_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc_00;
  fdb_status fVar4;
  int iVar5;
  fdb_status fVar6;
  fdb_status extraout_EAX;
  size_t sVar7;
  char *handle;
  fdb_kvs_handle *pfVar8;
  fdb_kvs_handle *pfVar9;
  size_t sVar10;
  size_t sVar11;
  fdb_iterator *doc_01;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *in_RCX;
  btree *extraout_RDX;
  char *pcVar14;
  fdb_kvs_handle *doc_02;
  uint uVar15;
  fdb_kvs_handle *unaff_RBP;
  fdb_iterator *pfVar16;
  char *unaff_R12;
  fdb_kvs_handle *__s;
  char *unaff_R13;
  long lVar17;
  btree *__s_00;
  ulong uVar18;
  __atomic_base<unsigned_long> handle_00;
  fdb_doc **doc_03;
  fdb_iterator *config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *doc;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db3;
  fdb_kvs_handle *snap_db2;
  fdb_kvs_handle *snap_db1;
  fdb_kvs_handle *psnap_db3;
  fdb_kvs_handle *psnap_db2;
  fdb_kvs_handle *psnap_db1;
  fdb_kvs_config kvs_config;
  char bodybuf [32];
  char metabuf [32];
  char keybuf [32];
  timeval __test_begin;
  char newKey [32];
  fdb_config fconfig;
  fdb_doc *pfStack_1298;
  fdb_iterator *pfStack_1290;
  int iStack_1284;
  fdb_kvs_handle *pfStack_1280;
  timeval tStack_1278;
  fdb_kvs_handle *pfStack_1268;
  fdb_kvs_handle *pfStack_1260;
  fdb_kvs_handle *pfStack_1258;
  fdb_kvs_handle *pfStack_1250;
  fdb_iterator *pfStack_1248;
  fdb_iterator *pfStack_1240;
  fdb_kvs_handle *pfStack_1230;
  fdb_kvs_handle *pfStack_1228;
  undefined1 auStack_1220 [24];
  fdb_kvs_handle *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  fdb_kvs_handle *pfStack_11f0;
  undefined1 auStack_11e8 [80];
  undefined8 auStack_1198 [5];
  fdb_doc *apfStack_1170 [6];
  fdb_kvs_info fStack_1140;
  timeval tStack_1110;
  undefined1 auStack_1100 [280];
  fdb_iterator fStack_fe8;
  fdb_kvs_handle fStack_ee8;
  fdb_kvs_handle *pfStack_ce0;
  btree *pbStack_cd8;
  fdb_kvs_handle *pfStack_cd0;
  code *pcStack_cc8;
  fdb_iterator *pfStack_cb8;
  fdb_kvs_handle *pfStack_cb0;
  fdb_kvs_handle *pfStack_ca8;
  fdb_kvs_handle *pfStack_ca0;
  atomic<unsigned_long> *paStack_c98;
  size_t sStack_c90;
  fdb_kvs_handle *pfStack_c88;
  fdb_kvs_info fStack_c80;
  undefined1 auStack_c50 [14];
  undefined2 uStack_c42;
  undefined1 auStack_c40 [520];
  fdb_kvs_handle *pfStack_a38;
  fdb_kvs_handle *pfStack_a30;
  fdb_kvs_handle *pfStack_a28;
  fdb_kvs_handle *pfStack_a20;
  fdb_kvs_handle *pfStack_a18;
  fdb_kvs_handle *pfStack_a10;
  undefined1 auStack_a00 [8];
  fdb_file_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_kvs_handle *pfStack_9e8;
  fdb_iterator *pfStack_9e0;
  undefined1 auStack_9d8 [48];
  undefined1 auStack_9a8 [64];
  hbtrie *phStack_968;
  kvs_ops_stat *pkStack_960;
  timeval tStack_938;
  btreeblk_handle *apbStack_928 [33];
  undefined1 auStack_820 [32];
  undefined2 uStack_800;
  undefined1 uStack_7e0;
  code *pcStack_7c8;
  undefined4 uStack_7c0;
  fdb_txn *pfStack_7b8;
  fdb_kvs_handle *pfStack_728;
  char acStack_720 [256];
  fdb_kvs_handle *pfStack_620;
  fdb_kvs_handle *pfStack_618;
  fdb_kvs_handle *pfStack_610;
  fdb_kvs_handle *pfStack_608;
  fdb_kvs_handle *pfStack_600;
  fdb_kvs_handle *pfStack_5f8;
  fdb_kvs_handle *pfStack_5e8;
  uint uStack_5dc;
  fdb_iterator *pfStack_5d8;
  fdb_kvs_handle *pfStack_5d0;
  undefined4 *puStack_5c8;
  fdb_kvs_handle *pfStack_5c0;
  fdb_kvs_handle *pfStack_5b8;
  fdb_iterator *pfStack_5b0;
  fdb_file_handle *pfStack_5a8;
  fdb_iterator *pfStack_5a0;
  size_t sStack_598;
  undefined1 auStack_590 [32];
  timeval tStack_570;
  undefined1 auStack_560 [272];
  size_t sStack_450;
  char *pcStack_448;
  uint8_t uStack_440;
  undefined2 uStack_438;
  undefined1 uStack_418;
  fdb_kvs_handle *pfStack_360;
  char acStack_358 [256];
  fdb_doc **ppfStack_258;
  fdb_kvs_handle *pfStack_250;
  fdb_kvs_handle *pfStack_248;
  fdb_kvs_handle *pfStack_240;
  fdb_kvs_handle *pfStack_238;
  fdb_kvs_handle *pfStack_230;
  fdb_kvs_handle *local_220;
  fdb_file_handle *local_218;
  fdb_doc *local_210;
  fdb_doc *local_208;
  fdb_kvs_handle *local_200;
  fdb_kvs_handle *local_1f8;
  fdb_kvs_handle *local_1f0;
  fdb_kvs_handle *local_1e8;
  fdb_kvs_handle *local_1e0;
  fdb_kvs_handle *local_1d8;
  fdb_kvs_config local_1d0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [80];
  undefined1 local_148 [48];
  hbtrie *local_118;
  undefined4 local_104;
  uint8_t local_f9;
  char *local_70;
  
  handle = (char *)0x0;
  pfStack_230 = (fdb_kvs_handle *)0x11239f;
  gettimeofday((timeval *)(local_198 + 0x40),(__timezone_ptr_t)0x0);
  pfStack_230 = (fdb_kvs_handle *)0x1123a4;
  memleak_start();
  local_210 = (fdb_doc *)0x0;
  pcVar14 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_230 = (fdb_kvs_handle *)0x1123b8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar8 = (fdb_kvs_handle *)(local_148 + 0x20);
  pfStack_230 = (fdb_kvs_handle *)0x1123c8;
  fdb_get_default_config();
  pfStack_230 = (fdb_kvs_handle *)0x1123d2;
  fdb_get_default_kvs_config();
  local_118 = (hbtrie *)0x400;
  local_104 = 1;
  local_f9 = '\0';
  local_70 = (char *)0x0;
  pfStack_230 = (fdb_kvs_handle *)0x1123f6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_230 = (fdb_kvs_handle *)0x11240a;
  fVar4 = fdb_open(&local_218,"./mvcc_test1",(fdb_config *)pfVar8);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_230 = (fdb_kvs_handle *)0x112426;
    fVar4 = fdb_kvs_open_default(local_218,&local_220,&local_1d0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ba;
    pfStack_230 = (fdb_kvs_handle *)0x112446;
    fVar4 = fdb_set_log_callback(local_220,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127bf;
    pcVar14 = local_198 + 0x20;
    local_198._32_4_ = 0x79656b;
    pfVar8 = (fdb_kvs_handle *)local_198;
    local_198[4] = 0;
    local_198._0_4_ = 0x6174656d;
    handle = local_1b8;
    local_1b8[4] = 0;
    local_1b8._0_4_ = 0x79646f62;
    pfStack_230 = (fdb_kvs_handle *)0x112489;
    unaff_R12 = (char *)strlen(pcVar14);
    pfStack_230 = (fdb_kvs_handle *)0x112494;
    unaff_R13 = (char *)strlen((char *)pfVar8);
    pfStack_230 = (fdb_kvs_handle *)0x11249f;
    sVar7 = strlen(handle);
    unaff_RBP = (fdb_kvs_handle *)&local_210;
    pfStack_230 = (fdb_kvs_handle *)0x1124bf;
    in_RCX = pfVar8;
    fdb_doc_create((fdb_doc **)unaff_RBP,pcVar14,(size_t)unaff_R12,pfVar8,(size_t)unaff_R13,handle,
                   sVar7);
    pfStack_230 = (fdb_kvs_handle *)0x1124cd;
    fdb_set(local_220,local_210);
    pfStack_230 = (fdb_kvs_handle *)0x1124d9;
    fdb_commit(local_218,'\0');
    pfStack_230 = (fdb_kvs_handle *)0x1124ef;
    fVar4 = fdb_snapshot_open(local_220,&local_1f0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127c4;
    pfStack_230 = (fdb_kvs_handle *)0x112506;
    fVar4 = fdb_set(local_220,local_210);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127c9;
    pfStack_230 = (fdb_kvs_handle *)0x11251a;
    fVar4 = fdb_commit(local_218,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ce;
    pfStack_230 = (fdb_kvs_handle *)0x112538;
    fVar4 = fdb_snapshot_open(local_220,&local_1f8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127d3;
    pfStack_230 = (fdb_kvs_handle *)0x11254f;
    fVar4 = fdb_set(local_220,local_210);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127d8;
    pfStack_230 = (fdb_kvs_handle *)0x112563;
    fVar4 = fdb_commit(local_218,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127dd;
    pfStack_230 = (fdb_kvs_handle *)0x11257a;
    fVar4 = fdb_set(local_220,local_210);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127e2;
    pfStack_230 = (fdb_kvs_handle *)0x11258e;
    fVar4 = fdb_commit(local_218,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127e7;
    pcVar14 = (char *)&local_210;
    pfStack_230 = (fdb_kvs_handle *)0x1125a3;
    fdb_doc_free(local_210);
    pfVar8 = (fdb_kvs_handle *)local_148;
    local_148._0_4_ = 0x79654b;
    pfStack_230 = (fdb_kvs_handle *)0x1125ba;
    handle = (char *)strlen((char *)pfVar8);
    unaff_R12 = local_198;
    pfStack_230 = (fdb_kvs_handle *)0x1125cd;
    unaff_R13 = (char *)strlen(unaff_R12);
    unaff_RBP = (fdb_kvs_handle *)local_1b8;
    pfStack_230 = (fdb_kvs_handle *)0x1125dd;
    sVar7 = strlen((char *)unaff_RBP);
    pfStack_230 = (fdb_kvs_handle *)0x1125f8;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar14,pfVar8,(size_t)handle,unaff_R12,(size_t)unaff_R13,unaff_RBP,
                   sVar7);
    pfStack_230 = (fdb_kvs_handle *)0x112605;
    fdb_set(local_220,local_210);
    pfStack_230 = (fdb_kvs_handle *)0x11261b;
    fVar4 = fdb_snapshot_open(local_220,&local_200,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ec;
    pcVar14 = local_198 + 0x20;
    pfStack_230 = (fdb_kvs_handle *)0x112633;
    sVar7 = strlen(pcVar14);
    pfVar8 = (fdb_kvs_handle *)&local_208;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_230 = (fdb_kvs_handle *)0x112656;
    fdb_doc_create((fdb_doc **)pfVar8,pcVar14,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_230 = (fdb_kvs_handle *)0x112663;
    fVar4 = fdb_get(local_1f0,local_208);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127f1;
    pfStack_230 = (fdb_kvs_handle *)0x11267a;
    fVar4 = fdb_get(local_1f8,local_208);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127f6;
    pfStack_230 = (fdb_kvs_handle *)0x112691;
    fVar4 = fdb_get(local_200,local_208);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127fb;
    pfStack_230 = (fdb_kvs_handle *)0x1126a3;
    fdb_doc_free(local_208);
    pfStack_230 = (fdb_kvs_handle *)0x1126b7;
    fVar4 = fdb_snapshot_open(local_220,&local_1d8,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112800;
    pfStack_230 = (fdb_kvs_handle *)0x1126d3;
    fVar4 = fdb_snapshot_open(local_220,&local_1e0,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112805;
    pfStack_230 = (fdb_kvs_handle *)0x1126ef;
    fVar4 = fdb_snapshot_open(local_220,&local_1e8,3);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011280a;
    pfStack_230 = (fdb_kvs_handle *)0x112701;
    fdb_kvs_close(local_1f0);
    pfStack_230 = (fdb_kvs_handle *)0x11270b;
    fdb_kvs_close(local_1f8);
    pfStack_230 = (fdb_kvs_handle *)0x112715;
    fdb_kvs_close(local_200);
    pfStack_230 = (fdb_kvs_handle *)0x112724;
    fVar4 = fdb_commit(local_218,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_230 = (fdb_kvs_handle *)0x112736;
      fdb_kvs_close(local_1d8);
      pfStack_230 = (fdb_kvs_handle *)0x112740;
      fdb_kvs_close(local_1e0);
      pfStack_230 = (fdb_kvs_handle *)0x11274a;
      fdb_kvs_close(local_1e8);
      pfStack_230 = (fdb_kvs_handle *)0x112754;
      fdb_kvs_close(local_220);
      pfStack_230 = (fdb_kvs_handle *)0x11275e;
      fdb_close(local_218);
      pfStack_230 = (fdb_kvs_handle *)0x112768;
      fdb_doc_free(local_210);
      pfStack_230 = (fdb_kvs_handle *)0x11276d;
      fdb_shutdown();
      pfStack_230 = (fdb_kvs_handle *)0x112772;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_230 = (fdb_kvs_handle *)0x1127a3;
      fprintf(_stderr,pcVar14,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_230 = (fdb_kvs_handle *)0x1127ba;
    in_memory_snapshot_cleanup_test();
LAB_001127ba:
    pfStack_230 = (fdb_kvs_handle *)0x1127bf;
    in_memory_snapshot_cleanup_test();
LAB_001127bf:
    pfStack_230 = (fdb_kvs_handle *)0x1127c4;
    in_memory_snapshot_cleanup_test();
LAB_001127c4:
    pfStack_230 = (fdb_kvs_handle *)0x1127c9;
    in_memory_snapshot_cleanup_test();
LAB_001127c9:
    pfStack_230 = (fdb_kvs_handle *)0x1127ce;
    in_memory_snapshot_cleanup_test();
LAB_001127ce:
    pfStack_230 = (fdb_kvs_handle *)0x1127d3;
    in_memory_snapshot_cleanup_test();
LAB_001127d3:
    pfStack_230 = (fdb_kvs_handle *)0x1127d8;
    in_memory_snapshot_cleanup_test();
LAB_001127d8:
    pfStack_230 = (fdb_kvs_handle *)0x1127dd;
    in_memory_snapshot_cleanup_test();
LAB_001127dd:
    pfStack_230 = (fdb_kvs_handle *)0x1127e2;
    in_memory_snapshot_cleanup_test();
LAB_001127e2:
    pfStack_230 = (fdb_kvs_handle *)0x1127e7;
    in_memory_snapshot_cleanup_test();
LAB_001127e7:
    pfStack_230 = (fdb_kvs_handle *)0x1127ec;
    in_memory_snapshot_cleanup_test();
LAB_001127ec:
    pfStack_230 = (fdb_kvs_handle *)0x1127f1;
    in_memory_snapshot_cleanup_test();
LAB_001127f1:
    pfStack_230 = (fdb_kvs_handle *)0x1127f6;
    in_memory_snapshot_cleanup_test();
LAB_001127f6:
    pfStack_230 = (fdb_kvs_handle *)0x1127fb;
    in_memory_snapshot_cleanup_test();
LAB_001127fb:
    pfStack_230 = (fdb_kvs_handle *)0x112800;
    in_memory_snapshot_cleanup_test();
LAB_00112800:
    pfStack_230 = (fdb_kvs_handle *)0x112805;
    in_memory_snapshot_cleanup_test();
LAB_00112805:
    pfStack_230 = (fdb_kvs_handle *)0x11280a;
    in_memory_snapshot_cleanup_test();
LAB_0011280a:
    pfStack_230 = (fdb_kvs_handle *)0x11280f;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_230 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_5f8 = (fdb_kvs_handle *)0x112834;
  ppfStack_258 = (fdb_doc **)pcVar14;
  pfStack_250 = (fdb_kvs_handle *)unaff_R12;
  pfStack_248 = (fdb_kvs_handle *)unaff_R13;
  pfStack_240 = pfVar8;
  pfStack_238 = (fdb_kvs_handle *)handle;
  pfStack_230 = unaff_RBP;
  gettimeofday(&tStack_570,(__timezone_ptr_t)0x0);
  pfStack_360 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_358,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_5f8 = (fdb_kvs_handle *)0x11285c;
  system((char *)&pfStack_360);
  pfStack_5f8 = (fdb_kvs_handle *)0x112861;
  memleak_start();
  pfStack_5f8 = (fdb_kvs_handle *)0x11286b;
  pfVar8 = (fdb_kvs_handle *)malloc(0x20);
  pcVar14 = auStack_560 + 0x108;
  pfStack_5f8 = (fdb_kvs_handle *)0x11287e;
  fdb_get_default_config();
  uStack_438._0_1_ = true;
  uStack_438._1_1_ = true;
  uStack_440 = '\x01';
  pcStack_448 = (char *)0x3c;
  uStack_418 = 1;
  sStack_450 = 0;
  pfStack_5f8 = (fdb_kvs_handle *)0x1128a9;
  fdb_get_default_kvs_config();
  pfStack_5f8 = (fdb_kvs_handle *)0x1128bd;
  fVar4 = fdb_open(&pfStack_5a8,"./mvcc_test",(fdb_config *)pcVar14);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130d2;
  in_RCX = (fdb_kvs_handle *)(auStack_590 + 8);
  pfStack_5f8 = (fdb_kvs_handle *)0x1128e0;
  fVar4 = fdb_kvs_open(pfStack_5a8,&pfStack_5c0,"db",(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130d7;
  puStack_5c8 = (undefined4 *)((long)&pfVar8->kvs + 2);
  pcVar14 = "k%05d";
  handle = auStack_560;
  unaff_R12 = "value%08d";
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_5f8 = (fdb_kvs_handle *)0x11291b;
    sprintf(handle,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112949;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    unaff_R13 = (char *)pfStack_5c0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112956;
    sVar7 = strlen(handle);
    pfStack_5f8 = (fdb_kvs_handle *)0x11296e;
    in_RCX = pfVar8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar8,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113057;
    uVar15 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar15;
  } while (uVar15 != 0x1e);
  pfStack_5f8 = (fdb_kvs_handle *)0x11298c;
  fVar4 = fdb_commit(pfStack_5a8,'\x01');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130dc;
  pfStack_5f8 = (fdb_kvs_handle *)0x1129aa;
  fVar4 = fdb_snapshot_open(pfStack_5c0,&pfStack_5d0,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130e1;
  pfStack_5f8 = (fdb_kvs_handle *)0x1129c8;
  fVar4 = fdb_snapshot_open(pfStack_5d0,&pfStack_5b8,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130e6;
  unaff_RBP = (fdb_kvs_handle *)0x1e;
  handle = auStack_560;
  unaff_R12 = "value%08d";
  do {
    pfStack_5f8 = (fdb_kvs_handle *)0x1129fa;
    sprintf(handle,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112a28;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    unaff_R13 = (char *)pfStack_5c0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112a35;
    sVar7 = strlen(handle);
    pfStack_5f8 = (fdb_kvs_handle *)0x112a4d;
    in_RCX = pfVar8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar8,0x20);
    pfVar9 = (fdb_kvs_handle *)"k%05d";
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011305c;
    uVar15 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar15;
  } while (uVar15 != 300);
  pfStack_5f8 = (fdb_kvs_handle *)0x112a7d;
  sprintf((char *)auStack_560,"k%05d",0x1e);
  handle = (char *)pfStack_5d0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112a8a;
  sVar7 = strlen((char *)auStack_560);
  in_RCX = (fdb_kvs_handle *)auStack_590;
  pfStack_5f8 = (fdb_kvs_handle *)0x112aa3;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)handle,(fdb_kvs_handle *)auStack_560,sVar7 + 1,
                     (void **)in_RCX,&sStack_598);
  pfVar9 = pfStack_5b8;
  pcVar14 = (char *)auStack_560;
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001130eb;
  handle = auStack_560;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ac0;
  sVar7 = strlen(handle);
  in_RCX = (fdb_kvs_handle *)auStack_590;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ad9;
  fVar4 = fdb_get_kv(pfVar9,handle,sVar7 + 1,(void **)in_RCX,&sStack_598);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001130f0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112aeb;
  fVar4 = fdb_kvs_close(pfStack_5d0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130f5;
  pfStack_5f8 = (fdb_kvs_handle *)0x112afd;
  fVar4 = fdb_kvs_close(pfStack_5b8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130fa;
  pfStack_5f8 = (fdb_kvs_handle *)0x112b1b;
  fVar4 = fdb_snapshot_open(pfStack_5c0,&pfStack_5d0,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130ff;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112b43;
  fVar4 = fdb_iterator_init(pfStack_5d0,&pfStack_5d8,(void *)0x0,0,(void *)0x0,0,0);
  pcVar14 = (char *)pfVar9;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113104;
  unaff_R12 = auStack_560;
  unaff_R13 = "value%08d";
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112b74;
    fVar4 = fdb_iterator_get(pfStack_5d8,(fdb_doc **)&pfStack_5e8);
    pcVar14 = (char *)pfVar9;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_5f8 = (fdb_kvs_handle *)0x112b8f;
    sprintf(unaff_R12,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112bbd;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    pfVar9 = pfStack_5e8;
    handle = (char *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112bd4;
    iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_00113061;
    handle = (char *)(pfVar9->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112bef;
    iVar5 = bcmp(handle,pfVar8,(size_t)(pfVar9->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00113071;
    unaff_RBP = (fdb_kvs_handle *)(ulong)((int)unaff_RBP + 1);
    pfStack_5f8 = (fdb_kvs_handle *)0x112c01;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfStack_5f8 = (fdb_kvs_handle *)0x112c0b;
    fVar4 = fdb_iterator_next(pfStack_5d8);
    pcVar14 = (char *)pfVar9;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP != 300) goto LAB_00113109;
  pfStack_5f8 = (fdb_kvs_handle *)0x112c29;
  fVar4 = fdb_iterator_close(pfStack_5d8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011310e;
  pfStack_5f8 = (fdb_kvs_handle *)0x112c47;
  fVar4 = fdb_snapshot_open(pfStack_5d0,&pfStack_5b8,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113113;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112c6f;
  fVar4 = fdb_iterator_init(pfStack_5d0,&pfStack_5d8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113118;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112c97;
  fVar4 = fdb_iterator_init(pfStack_5b8,&pfStack_5a0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011311d;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112cbf;
  fVar4 = fdb_iterator_init(pfStack_5c0,&pfStack_5b0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113122;
  unaff_R12 = auStack_560;
  unaff_R13 = "value%08d";
  handle = "k%06d";
  uStack_5dc = 0;
  do {
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112cfd;
    fVar4 = fdb_iterator_get(pfStack_5d8,(fdb_doc **)&pfStack_5e8);
    uVar15 = uStack_5dc;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ea7;
    pfStack_5f8 = (fdb_kvs_handle *)0x112d1c;
    sprintf(unaff_R12,"k%05d",(ulong)uStack_5dc);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112d4a;
    sprintf((char *)pfVar8,"value%08d",(ulong)uVar15);
    pfVar9 = pfStack_5e8;
    unaff_RBP = (fdb_kvs_handle *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112d61;
    iVar5 = bcmp(unaff_RBP,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_0011307c;
    unaff_RBP = (fdb_kvs_handle *)(pfVar9->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112d7c;
    iVar5 = bcmp(unaff_RBP,pfVar8,(size_t)(pfVar9->kvs_config).custom_cmp_param);
    pcVar14 = (char *)pfVar9;
    if (iVar5 != 0) goto LAB_001130ac;
    pfStack_5f8 = (fdb_kvs_handle *)0x112d8c;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112da4;
    fVar4 = fdb_iterator_get(pfStack_5d8,(fdb_doc **)&pfStack_5e8);
    pcVar14 = (char *)pfStack_5e8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011308c;
    unaff_RBP = (fdb_kvs_handle *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112dc3;
    iVar5 = bcmp(unaff_RBP,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_00113091;
    unaff_RBP = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar14)->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112dde;
    iVar5 = bcmp(unaff_RBP,pfVar8,(size_t)(((fdb_kvs_handle *)pcVar14)->kvs_config).custom_cmp_param
                );
    if (iVar5 != 0) goto LAB_001130a1;
    uVar15 = uStack_5dc + 1;
    pfStack_5f8 = (fdb_kvs_handle *)0x112df4;
    fdb_doc_free((fdb_doc *)pcVar14);
    uStack_5dc = uVar15;
    if (uVar15 == 0x3c) {
      pcVar14 = (char *)0x0;
      do {
        pfStack_5f8 = (fdb_kvs_handle *)0x112e10;
        sprintf(unaff_R12,"k%06d",pcVar14);
        *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
        *puStack_5c8 = 0x646e653c;
        pfStack_5f8 = (fdb_kvs_handle *)0x112e3f;
        sprintf((char *)pfVar8,"value%08d",pcVar14);
        unaff_RBP = pfStack_5c0;
        pfStack_5f8 = (fdb_kvs_handle *)0x112e4c;
        sVar7 = strlen(unaff_R12);
        pfStack_5f8 = (fdb_kvs_handle *)0x112e64;
        in_RCX = pfVar8;
        fVar4 = fdb_set_kv(unaff_RBP,unaff_R12,sVar7 + 1,pfVar8,0x20);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_5f8 = (fdb_kvs_handle *)0x113057;
          in_memory_snapshot_on_dirty_hbtrie_test();
          goto LAB_00113057;
        }
        uVar15 = (int)pcVar14 + 1;
        pcVar14 = (char *)(ulong)uVar15;
      } while (uVar15 != 3000);
    }
    pfStack_5f8 = (fdb_kvs_handle *)0x112e82;
    fVar6 = fdb_iterator_next(pfStack_5d8);
    unaff_RBP = (fdb_kvs_handle *)(ulong)(uint)fVar6;
    pfStack_5f8 = (fdb_kvs_handle *)0x112e8e;
    fVar4 = fdb_iterator_next(pfStack_5a0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112e9f;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  pfStack_5f8 = (fdb_kvs_handle *)0x112e9f;
  in_memory_snapshot_on_dirty_hbtrie_test();
  fVar4 = extraout_EAX;
LAB_00112e9f:
  if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00112ea7:
    if (uStack_5dc != 300) goto LAB_00113127;
    pfStack_5f8 = (fdb_kvs_handle *)0x112ebf;
    fVar4 = fdb_iterator_close(pfStack_5d8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011312c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112ed1;
    fVar4 = fdb_iterator_close(pfStack_5a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113131;
    unaff_R12 = auStack_560;
    unaff_R13 = "value%08d";
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      pfStack_5e8 = (fdb_kvs_handle *)0x0;
      pfStack_5f8 = (fdb_kvs_handle *)0x112f02;
      fVar4 = fdb_iterator_get(pfStack_5b0,(fdb_doc **)&pfStack_5e8);
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfStack_5f8 = (fdb_kvs_handle *)0x112f1d;
      sprintf(unaff_R12,"k%05d",unaff_RBP);
      *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
      *puStack_5c8 = 0x646e653c;
      pfStack_5f8 = (fdb_kvs_handle *)0x112f4b;
      sprintf((char *)pfVar8,"value%08d",unaff_RBP);
      pcVar14 = (char *)pfStack_5e8;
      handle = (char *)pfStack_5e8->op_stats;
      pfStack_5f8 = (fdb_kvs_handle *)0x112f62;
      iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
      if (iVar5 != 0) goto LAB_001130b7;
      handle = (char *)(((fdb_kvs_handle *)pcVar14)->field_6).seqtree;
      pfStack_5f8 = (fdb_kvs_handle *)0x112f7d;
      iVar5 = bcmp(handle,pfVar8,(size_t)(((fdb_kvs_handle *)pcVar14)->kvs_config).custom_cmp_param)
      ;
      if (iVar5 != 0) goto LAB_001130c7;
      unaff_RBP = (fdb_kvs_handle *)(ulong)((int)unaff_RBP + 1);
      pfStack_5f8 = (fdb_kvs_handle *)0x112f8f;
      fdb_doc_free((fdb_doc *)pcVar14);
      pfStack_5f8 = (fdb_kvs_handle *)0x112f99;
      fVar4 = fdb_iterator_next(pfStack_5b0);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP != 300) goto LAB_00113136;
    pfStack_5f8 = (fdb_kvs_handle *)0x112fb7;
    fVar4 = fdb_iterator_close(pfStack_5b0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011313b;
    pfStack_5f8 = (fdb_kvs_handle *)0x112fc9;
    fVar4 = fdb_kvs_close(pfStack_5d0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113140;
    pfStack_5f8 = (fdb_kvs_handle *)0x112fdb;
    fVar4 = fdb_kvs_close(pfStack_5b8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113145;
    pfStack_5f8 = (fdb_kvs_handle *)0x112fed;
    fVar4 = fdb_close(pfStack_5a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
    pfStack_5f8 = (fdb_kvs_handle *)0x112ffa;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_5f8 = (fdb_kvs_handle *)0x11300a;
      free(pfVar8);
      pfStack_5f8 = (fdb_kvs_handle *)0x11300f;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_5f8 = (fdb_kvs_handle *)0x113040;
      fprintf(_stderr,pcVar14,"in-memory snapshot on dirty HB+trie nodes test");
      return;
    }
    goto LAB_0011314f;
  }
  goto LAB_00113154;
LAB_00113614:
  pfStack_a10 = (fdb_kvs_handle *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pfStack_a10 = (fdb_kvs_handle *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pfStack_a10 = (fdb_kvs_handle *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pfStack_a10 = (fdb_kvs_handle *)0x11364a;
  in_memory_snapshot_compaction_test();
  goto LAB_0011364a;
LAB_00113ba0:
  pcStack_cc8 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_cc8 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_cc8 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  handle_00._M_i = (__int_type)(auStack_c40 + 0x100);
  __s = (fdb_kvs_handle *)auStack_c40;
  pcStack_cc8 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_1240 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar13 = pfVar12;
LAB_0011467d:
  pfVar12 = pfVar13;
  pfStack_1240 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_1240 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar9 = (fdb_kvs_handle *)&pfStack_1228;
  pfStack_1240 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00113057:
  pfStack_5f8 = (fdb_kvs_handle *)0x11305c;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar9 = (fdb_kvs_handle *)pcVar14;
LAB_0011305c:
  pfStack_5f8 = (fdb_kvs_handle *)0x113061;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113061:
  pfStack_5f8 = (fdb_kvs_handle *)0x113071;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113071:
  pfStack_5f8 = (fdb_kvs_handle *)0x11307c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011307c:
  pfStack_5f8 = (fdb_kvs_handle *)0x11308c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011308c:
  pcVar14 = (char *)pfVar9;
  pfStack_5f8 = (fdb_kvs_handle *)0x113091;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113091:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130a1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130a1:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130ac;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ac:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130b7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130b7:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130c7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130c7:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130d2;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d2:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130d7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d7:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130dc;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130dc:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130e1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e1:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130e6;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e6:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130eb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130eb:
  pfVar9 = (fdb_kvs_handle *)pcVar14;
  pfStack_5f8 = (fdb_kvs_handle *)0x1130f0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f0:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130f5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f5:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130fa;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130fa:
  pfStack_5f8 = (fdb_kvs_handle *)0x1130ff;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ff:
  pfStack_5f8 = (fdb_kvs_handle *)0x113104;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pcVar14 = (char *)pfVar9;
LAB_00113104:
  pfStack_5f8 = (fdb_kvs_handle *)0x113109;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113109:
  pfStack_5f8 = (fdb_kvs_handle *)0x11310e;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011310e:
  pfStack_5f8 = (fdb_kvs_handle *)0x113113;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113113:
  pfStack_5f8 = (fdb_kvs_handle *)0x113118;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113118:
  pfStack_5f8 = (fdb_kvs_handle *)0x11311d;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011311d:
  pfStack_5f8 = (fdb_kvs_handle *)0x113122;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113122:
  pfStack_5f8 = (fdb_kvs_handle *)0x113127;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113127:
  pfStack_5f8 = (fdb_kvs_handle *)0x11312c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011312c:
  pfStack_5f8 = (fdb_kvs_handle *)0x113131;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113131:
  pfStack_5f8 = (fdb_kvs_handle *)0x113136;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113136:
  pfStack_5f8 = (fdb_kvs_handle *)0x11313b;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011313b:
  pfStack_5f8 = (fdb_kvs_handle *)0x113140;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113140:
  pfStack_5f8 = (fdb_kvs_handle *)0x113145;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113145:
  pfStack_5f8 = (fdb_kvs_handle *)0x11314a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314a:
  pfStack_5f8 = (fdb_kvs_handle *)0x11314f;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314f:
  pfStack_5f8 = (fdb_kvs_handle *)0x113154;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113154:
  pfStack_5f8 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_a10 = (fdb_kvs_handle *)0x113179;
  pfStack_620 = pfVar8;
  pfStack_618 = (fdb_kvs_handle *)unaff_R12;
  pfStack_610 = (fdb_kvs_handle *)unaff_R13;
  pfStack_608 = (fdb_kvs_handle *)pcVar14;
  pfStack_600 = (fdb_kvs_handle *)handle;
  pfStack_5f8 = unaff_RBP;
  gettimeofday(&tStack_938,(__timezone_ptr_t)0x0);
  auStack_a00._4_2_ = 100;
  auStack_a00._0_4_ = 0x3530256b;
  auStack_9d8._8_2_ = 100;
  auStack_9d8._0_8_ = 0x38302565756c6176;
  builtin_strncpy(acStack_720,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_728 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_a10 = (fdb_kvs_handle *)0x1131c6;
  system((char *)&pfStack_728);
  pfStack_a10 = (fdb_kvs_handle *)0x1131cb;
  memleak_start();
  pfStack_a10 = (fdb_kvs_handle *)0x1131d5;
  pfVar9 = (fdb_kvs_handle *)malloc(0x20);
  pfVar8 = (fdb_kvs_handle *)((long)apbStack_928 + 0x108);
  pfStack_a10 = (fdb_kvs_handle *)0x1131e8;
  fdb_get_default_config();
  uStack_800 = 0x201;
  auStack_820[0x18] = '\x01';
  auStack_820._16_8_ = (fdb_txn *)0x2;
  uStack_7e0 = 1;
  auStack_820._8_8_ = (fdb_log_callback)0x0;
  pcStack_7c8 = cb_inmem_snap;
  uStack_7c0 = 2;
  pfStack_7b8 = (fdb_txn *)auStack_9a8;
  pfStack_a10 = (fdb_kvs_handle *)0x113232;
  fdb_get_default_kvs_config();
  pfStack_a10 = (fdb_kvs_handle *)0x113246;
  fVar4 = fdb_open(&pfStack_9f8,"./mvcc_test",(fdb_config *)pfVar8);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_9a8 + 0x28);
    pfStack_a10 = (fdb_kvs_handle *)0x11326c;
    fVar4 = fdb_kvs_open(pfStack_9f8,(fdb_kvs_handle **)(auStack_9d8 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
    in_RCX = (fdb_kvs_handle *)(auStack_9a8 + 0x28);
    pfStack_a10 = (fdb_kvs_handle *)0x113292;
    fVar4 = fdb_kvs_open(pfStack_9f8,(fdb_kvs_handle **)(auStack_9d8 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113654;
    auStack_9a8._0_8_ = auStack_9d8._24_8_;
    auStack_9a8._8_8_ = (btree *)0xa;
    auStack_9a8._24_8_ = auStack_a00;
    handle = auStack_9d8;
    auStack_9a8._16_4_ = 0x20;
    pfVar8 = (fdb_kvs_handle *)((long)&pfVar9->kvs + 2);
    unaff_R12 = (char *)apbStack_928;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    auStack_9a8._32_8_ = handle;
    do {
      pfStack_a10 = (fdb_kvs_handle *)0x1132ee;
      sprintf(unaff_R12,auStack_a00,unaff_RBP);
      *(undefined4 *)&pfVar9->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar9->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar9->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)((long)&pfVar9->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar8->kvs_config = 0x646e653c;
      pfStack_a10 = (fdb_kvs_handle *)0x113319;
      sprintf((char *)pfVar9,handle,unaff_RBP);
      unaff_R13 = (char *)auStack_9d8._16_8_;
      pfStack_a10 = (fdb_kvs_handle *)0x113326;
      sVar7 = strlen(unaff_R12);
      pfStack_a10 = (fdb_kvs_handle *)0x11333e;
      in_RCX = pfVar9;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar7 + 1,pfVar9,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_a10 = (fdb_kvs_handle *)0x113614;
        in_memory_snapshot_compaction_test();
        goto LAB_00113614;
      }
      uVar15 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar15;
    } while (uVar15 != 10);
    pfStack_a10 = (fdb_kvs_handle *)0x11335c;
    fVar4 = fdb_commit(pfStack_9f8,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113659;
    pfStack_a10 = (fdb_kvs_handle *)0x113375;
    fVar4 = fdb_compact(pfStack_9f8,"./mvcc_test2");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
    pfStack_a10 = (fdb_kvs_handle *)0x113393;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_9d8._16_8_,&pfStack_9f0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113663;
    pfStack_a10 = (fdb_kvs_handle *)0x1133ad;
    fVar4 = fdb_get_kvs_info(pfStack_9f0,(fdb_kvs_info *)&phStack_968);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113668;
    if (pkStack_960 != (kvs_ops_stat *)0xb) {
      pfStack_a10 = (fdb_kvs_handle *)0x1133cd;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_a10 = (fdb_kvs_handle *)0x1133ed;
    fVar4 = fdb_iterator_init(pfStack_9f0,&pfStack_9e0,(void *)0x0,0,(void *)0x0,0,0);
    __s = (fdb_kvs_handle *)unaff_R12;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
    handle = (char *)apbStack_928;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      pfStack_9e8 = (fdb_kvs_handle *)0x0;
      pfStack_a10 = (fdb_kvs_handle *)0x113417;
      fVar4 = fdb_iterator_get(pfStack_9e0,(fdb_doc **)&pfStack_9e8);
      unaff_R12 = (char *)pfStack_9e8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((uint)unaff_RBP < 10) {
        pfStack_a10 = (fdb_kvs_handle *)0x113435;
        sprintf(handle,auStack_a00,unaff_RBP);
        *(undefined4 *)&pfVar9->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar9->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar9->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar9->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)((long)&pfVar9->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar8->kvs_config = 0x646e653c;
        pfStack_a10 = (fdb_kvs_handle *)0x113462;
        sprintf((char *)pfVar9,auStack_9d8,unaff_RBP);
        unaff_R12 = (char *)pfStack_9e8;
        unaff_R13 = (char *)pfStack_9e8->op_stats;
        pfStack_a10 = (fdb_kvs_handle *)0x11347b;
        iVar5 = bcmp(unaff_R13,handle,(size_t)*(fdb_doc **)&pfStack_9e8->kvs_config);
        if (iVar5 != 0) goto LAB_0011362f;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_a10 = (fdb_kvs_handle *)0x113498;
        iVar5 = bcmp(unaff_R13,pfVar9,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011363f;
      }
      else {
        apbStack_928[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_doc **)&pfVar9->kvs_config = (fdb_doc *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar9->kvs_config).custom_cmp = 0x65;
        unaff_R13 = (char *)pfStack_9e8->op_stats;
        pfStack_a10 = (fdb_kvs_handle *)0x1134df;
        iVar5 = bcmp(unaff_R13,handle,(size_t)*(fdb_doc **)&pfStack_9e8->kvs_config);
        if (iVar5 != 0) goto LAB_00113614;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_a10 = (fdb_kvs_handle *)0x1134fc;
        iVar5 = bcmp(unaff_R13,pfVar9,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113624;
      }
      unaff_RBP = (fdb_kvs_handle *)(ulong)((uint)unaff_RBP + 1);
      pfStack_a10 = (fdb_kvs_handle *)0x11350e;
      fdb_doc_free((fdb_doc *)unaff_R12);
      pfStack_a10 = (fdb_kvs_handle *)0x113518;
      fVar4 = fdb_iterator_next(pfStack_9e0);
      __s = (fdb_kvs_handle *)unaff_R12;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP != 0xb) goto LAB_00113672;
    pfStack_a10 = (fdb_kvs_handle *)0x113533;
    fVar4 = fdb_iterator_close(pfStack_9e0);
    pfVar12 = pfStack_9f0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113677;
    handle = (char *)apbStack_928;
    pfStack_a10 = (fdb_kvs_handle *)0x113550;
    sVar7 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)(auStack_9d8 + 0x28);
    pfStack_a10 = (fdb_kvs_handle *)0x113569;
    fVar4 = fdb_get_kv(pfVar12,handle,sVar7 + 1,(void **)in_RCX,(size_t *)(auStack_9d8 + 0x20));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
    pfStack_a10 = (fdb_kvs_handle *)0x113586;
    pfVar8 = pfVar9;
    iVar5 = bcmp((void *)auStack_9d8._40_8_,pfVar9,auStack_9d8._32_8_);
    pfVar12 = (fdb_kvs_handle *)auStack_9d8._40_8_;
    if (iVar5 != 0) goto LAB_00113681;
    pfStack_a10 = (fdb_kvs_handle *)0x113596;
    fdb_free_block((void *)auStack_9d8._40_8_);
    pfStack_a10 = (fdb_kvs_handle *)0x1135a0;
    fdb_kvs_close(pfStack_9f0);
    pfStack_a10 = (fdb_kvs_handle *)0x1135aa;
    fVar4 = fdb_close(pfStack_9f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
    pfStack_a10 = (fdb_kvs_handle *)0x1135b7;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_a10 = (fdb_kvs_handle *)0x1135c7;
      free(pfVar9);
      pfStack_a10 = (fdb_kvs_handle *)0x1135cc;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_a10 = (fdb_kvs_handle *)0x1135fd;
      fprintf(_stderr,pcVar14,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011364a:
    pfStack_a10 = (fdb_kvs_handle *)0x11364f;
    in_memory_snapshot_compaction_test();
LAB_0011364f:
    pfStack_a10 = (fdb_kvs_handle *)0x113654;
    in_memory_snapshot_compaction_test();
LAB_00113654:
    pfStack_a10 = (fdb_kvs_handle *)0x113659;
    in_memory_snapshot_compaction_test();
LAB_00113659:
    pfStack_a10 = (fdb_kvs_handle *)0x11365e;
    in_memory_snapshot_compaction_test();
LAB_0011365e:
    pfStack_a10 = (fdb_kvs_handle *)0x113663;
    in_memory_snapshot_compaction_test();
LAB_00113663:
    pfStack_a10 = (fdb_kvs_handle *)0x113668;
    in_memory_snapshot_compaction_test();
LAB_00113668:
    pfStack_a10 = (fdb_kvs_handle *)0x11366d;
    in_memory_snapshot_compaction_test();
    __s = (fdb_kvs_handle *)unaff_R12;
LAB_0011366d:
    pfStack_a10 = (fdb_kvs_handle *)0x113672;
    in_memory_snapshot_compaction_test();
LAB_00113672:
    pfStack_a10 = (fdb_kvs_handle *)0x113677;
    in_memory_snapshot_compaction_test();
LAB_00113677:
    pfVar12 = pfVar8;
    pfStack_a10 = (fdb_kvs_handle *)0x11367c;
    in_memory_snapshot_compaction_test();
LAB_0011367c:
    pfStack_a10 = (fdb_kvs_handle *)0x113681;
    in_memory_snapshot_compaction_test();
LAB_00113681:
    pfStack_a10 = (fdb_kvs_handle *)0x11368c;
    pfVar8 = pfVar12;
    in_memory_snapshot_compaction_test();
LAB_0011368c:
    pfStack_a10 = (fdb_kvs_handle *)0x113691;
    in_memory_snapshot_compaction_test();
  }
  pfStack_a10 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar18 = (ulong)pfVar8 & 0xffffffff;
  handle_00._M_i = 0;
  pcStack_cc8 = (code *)0x1136be;
  pfStack_a38 = pfVar9;
  pfStack_a30 = __s;
  pfStack_a28 = (fdb_kvs_handle *)unaff_R13;
  pfStack_a20 = pfVar12;
  pfStack_a18 = (fdb_kvs_handle *)handle;
  pfStack_a10 = unaff_RBP;
  gettimeofday((timeval *)auStack_c50,(__timezone_ptr_t)0x0);
  if ((int)pfVar8 != 2) {
    return;
  }
  __s_00 = extraout_RDX;
  if (extraout_RDX == (btree *)0x0) {
LAB_00113be0:
    pcStack_cc8 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_cc8 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_cc8 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_cc8 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_cc8 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_cc8 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_cc8 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar8 = (fdb_kvs_handle *)unaff_R13;
LAB_00113c03:
    pcStack_cc8 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    pfVar9 = in_RCX;
    pcStack_cc8 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_cc8 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (char *)CONCAT26(auStack_a00._6_2_,CONCAT24(auStack_a00._4_2_,auStack_a00._0_4_));
    pfVar8 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(((atomic<unsigned_long> *)
                             &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                            super___atomic_base<unsigned_long>)._M_i + 4);
    *(int *)((long)&(((atomic<unsigned_long> *)
                     &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                    super___atomic_base<unsigned_long>)._M_i + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_cc8 = (code *)0x11370e;
      fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                                *(__atomic_base<unsigned_long> *)
                                 &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_cb0,
                                0xffffffffffffffff);
      handle_00._M_i = (__int_type)pfVar8;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_cc8 = (code *)0x113725;
      fVar4 = fdb_get_kvs_info(pfStack_cb0,&fStack_c80);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
      if (fStack_c80.last_seqnum !=
          (long)(int)(((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                     super___atomic_base<unsigned_long>)._M_i) {
        pcStack_cc8 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_cc8 = (code *)0x11376a;
      pfStack_ca0 = pfVar8;
      paStack_c98 = (atomic<unsigned_long> *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_cb0,&pfStack_cb8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        __s_00 = (btree *)(auStack_c50 + 10);
        uVar18 = 0;
        do {
          pfStack_ca8 = (fdb_kvs_handle *)0x0;
          pcStack_cc8 = (code *)0x1137a1;
          fVar4 = fdb_iterator_get(pfStack_cb8,(fdb_doc **)&pfStack_ca8);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar17 = CONCAT26(auStack_a00._6_2_,CONCAT24(auStack_a00._4_2_,auStack_a00._0_4_));
          pcStack_cc8 = (code *)0x1137c1;
          sprintf(auStack_c40 + 0x100,*(char **)(lVar17 + 0x18),uVar18);
          sVar7 = (size_t)*(int *)(lVar17 + 0x10);
          pcStack_cc8 = (code *)0x1137d5;
          memset(auStack_c40,0x78,sVar7);
          *(undefined4 *)(&__s_00->ksize + sVar7) = 0x646e653c;
          *(undefined2 *)((long)&uStack_c42 + sVar7) = 0x3e;
          pcStack_cc8 = (code *)0x1137f5;
          sprintf(auStack_c40,*(char **)(lVar17 + 0x20),uVar18);
          unaff_R13 = (char *)pfStack_ca8;
          in_RCX = (fdb_kvs_handle *)pfStack_ca8->op_stats;
          pcStack_cc8 = (code *)0x11380d;
          iVar5 = bcmp(in_RCX,auStack_c40 + 0x100,*(size_t *)&pfStack_ca8->kvs_config);
          if (iVar5 != 0) {
            pcStack_cc8 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_cc8 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          in_RCX = (fdb_kvs_handle *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pcStack_cc8 = (code *)0x113828;
          iVar5 = bcmp(in_RCX,auStack_c40,
                       (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113b90;
          uVar18 = (ulong)((int)uVar18 + 1);
          pcStack_cc8 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_cc8 = (code *)0x113844;
          fVar4 = fdb_iterator_next(pfStack_cb8);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar18 != (int)(paStack_c98->super___atomic_base<unsigned_long>)._M_i) {
          pcStack_cc8 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_cc8 = (code *)0x113863;
        fVar4 = fdb_iterator_close(pfStack_cb8);
        pfVar8 = pfStack_ca0;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_cc8 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    in_RCX = (fdb_kvs_handle *)(auStack_c40 + 0x100);
    auStack_c40._256_4_ = 0x5f77656e;
    auStack_c40[0x104] = 'k';
    auStack_c40[0x105] = 'e';
    auStack_c40[0x106] = 'y';
    auStack_c40[0x107] = '\0';
    __s_00 = (btree *)auStack_c40;
    auStack_c40[0] = 'n';
    auStack_c40[1] = 'e';
    auStack_c40._2_2_ = 0x5f77;
    auStack_c40._4_4_ = 0x756c6176;
    auStack_c40._8_2_ = 0x65;
    handle_00._M_i = *(__int_type *)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    pcStack_cc8 = (code *)0x1138b7;
    pfStack_ca0 = pfVar8;
    sVar7 = strlen((char *)in_RCX);
    __s = (fdb_kvs_handle *)(sVar7 + 1);
    pcStack_cc8 = (code *)0x1138c3;
    sVar7 = strlen((char *)__s_00);
    pcStack_cc8 = (code *)0x1138d8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)handle_00._M_i,in_RCX,(size_t)__s,__s_00,sVar7 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_cc8 = (code *)0x1138f5;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                              *(__atomic_base<unsigned_long> *)
                               &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_cb0,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_cc8 = (code *)0x11390c;
    fVar4 = fdb_get_kvs_info(pfStack_cb0,&fStack_c80);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
    if (fStack_c80.last_seqnum !=
        (long)(int)(((atomic<unsigned_long> *)
                    &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 1U) {
      pcStack_cc8 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_cc8 = (code *)0x11394a;
    fVar4 = fdb_iterator_init(pfStack_cb0,&pfStack_cb8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar8 = (fdb_kvs_handle *)unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    pcVar14 = auStack_c40 + 0x100;
    __s = (fdb_kvs_handle *)auStack_c40;
    uVar18 = 0;
    do {
      pfStack_ca8 = (fdb_kvs_handle *)0x0;
      pcStack_cc8 = (code *)0x11397c;
      fVar4 = fdb_iterator_get(pfStack_cb8,(fdb_doc **)&pfStack_ca8);
      unaff_R13 = (char *)pfStack_ca8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar18 <
          (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i) {
        lVar17 = CONCAT26(auStack_a00._6_2_,CONCAT24(auStack_a00._4_2_,auStack_a00._0_4_));
        pcStack_cc8 = (code *)0x1139a4;
        sprintf(pcVar14,*(char **)(lVar17 + 0x18),uVar18);
        sVar7 = (size_t)*(int *)(lVar17 + 0x10);
        pcStack_cc8 = (code *)0x1139b8;
        memset(__s,0x78,sVar7);
        *(undefined4 *)(auStack_c50 + sVar7 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_c42 + sVar7) = 0x3e;
        pcStack_cc8 = (code *)0x1139dd;
        sprintf((char *)__s,*(char **)(lVar17 + 0x20),uVar18);
        unaff_R13 = (char *)pfStack_ca8;
        __s_00 = (btree *)(((atomic<unsigned_long> *)&pfStack_ca8->op_stats)->
                          super___atomic_base<unsigned_long>)._M_i;
        pcStack_cc8 = (code *)0x1139f5;
        iVar5 = bcmp(__s_00,pcVar14,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_ca8->kvs_config);
        if (iVar5 != 0) goto LAB_00113bb0;
        __s_00 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_cc8 = (code *)0x113a10;
        iVar5 = bcmp(__s_00,__s,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar5 != 0) goto LAB_00113bc0;
      }
      else {
        auStack_c40._256_4_ = 0x5f77656e;
        auStack_c40[0x104] = 'k';
        auStack_c40[0x105] = 'e';
        auStack_c40[0x106] = 'y';
        auStack_c40[0x107] = '\0';
        auStack_c40[0] = 'n';
        auStack_c40[1] = 'e';
        auStack_c40._2_2_ = 0x5f77;
        auStack_c40._4_4_ = 0x756c6176;
        auStack_c40._8_2_ = 0x65;
        __s_00 = (btree *)(((atomic<unsigned_long> *)&pfStack_ca8->op_stats)->
                          super___atomic_base<unsigned_long>)._M_i;
        pcStack_cc8 = (code *)0x113a5f;
        iVar5 = bcmp(__s_00,pcVar14,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_ca8->kvs_config);
        if (iVar5 != 0) goto LAB_00113bd0;
        __s_00 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_cc8 = (code *)0x113a7a;
        iVar5 = bcmp(__s_00,__s,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar5 != 0) goto LAB_00113ba0;
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pcStack_cc8 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_cc8 = (code *)0x113a96;
      fVar4 = fdb_iterator_next(pfStack_cb8);
      pfVar8 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar18 !=
        (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i + 1) {
      pcStack_cc8 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_cc8 = (code *)0x113ab4;
    fVar4 = fdb_iterator_close(pfStack_cb8);
    handle_00._M_i = (__int_type)pfStack_ca0;
    pfVar9 = pfStack_cb0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    __s_00 = (btree *)(auStack_c40 + 0x100);
    pcStack_cc8 = (code *)0x113ad6;
    sVar7 = strlen((char *)__s_00);
    pcStack_cc8 = (code *)0x113aef;
    fVar4 = fdb_get_kv(pfVar9,__s_00,sVar7 + 1,&pfStack_c88,&sStack_c90);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_cc8 = (code *)0x113b11;
    iVar5 = bcmp(pfStack_c88,auStack_c40,sStack_c90);
    pfVar9 = pfStack_c88;
    if (iVar5 == 0) {
      pcStack_cc8 = (code *)0x113b21;
      fdb_free_block(pfStack_c88);
LAB_00113b21:
      pcStack_cc8 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_cb0);
      return;
    }
  }
  pcStack_cc8 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_1240 = (fdb_iterator *)0x113c42;
  fStack_ee8.bub_ctx.space_used = (uint64_t)pfVar9;
  fStack_ee8.bub_ctx.handle = __s;
  pfStack_ce0 = pfVar8;
  pbStack_cd8 = __s_00;
  pfStack_cd0 = (fdb_kvs_handle *)handle_00._M_i;
  pcStack_cc8 = (code *)uVar18;
  gettimeofday(&tStack_1110,(__timezone_ptr_t)0x0);
  pfStack_1240 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_1240 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_kvs_handle *)&fStack_ee8.config.encryption_key;
  pfStack_1240 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1100;
  pfStack_1240 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_ee8.config.encryption_key.bytes[4] = '\0';
  fStack_ee8.config.encryption_key.bytes[5] = '\0';
  fStack_ee8.config.encryption_key.bytes[6] = '\0';
  fStack_ee8.config.encryption_key.bytes[7] = '\0';
  fStack_ee8.config.encryption_key.bytes[8] = '\0';
  fStack_ee8.config.encryption_key.bytes[9] = '\0';
  fStack_ee8.config.encryption_key.bytes[10] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xb] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xc] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xd] = '\x04';
  fStack_ee8.config.encryption_key.bytes[0xe] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xf] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x10] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x11] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x12] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x13] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_ee8.config._180_4_ = 1;
  fStack_ee8.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1240 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)(auStack_1220 + 0x10);
  pfStack_1240 = (fdb_iterator *)0x113cb7;
  fVar4 = fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",(fdb_config *)pfVar12);
  doc_01 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_1240 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1220._16_8_,&pfStack_1230,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_1240 = (fdb_iterator *)0x113ce2;
    fVar4 = fdb_snapshot_open(pfStack_1230,(fdb_kvs_handle **)(auStack_1220 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_1240 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1220._8_8_,(fdb_kvs_info *)(apfStack_1170 + 6));
    if ((fdb_kvs_handle *)fStack_1140.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_1240 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar9 = (fdb_kvs_handle *)auStack_1220;
    pfStack_1240 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1220._8_8_,(fdb_iterator **)pfVar9,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_1240 = (fdb_iterator *)0x113d3a;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1220._0_8_);
    pfVar13 = __s;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_1240 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_1220._0_8_);
    pfStack_1240 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1220._8_8_);
    lVar17 = 0;
    uVar18 = 0;
    do {
      pfStack_1240 = (fdb_iterator *)0x113d79;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_fe8,"meta%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_ee8,"body%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113dc1;
      sVar7 = strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x113dcc;
      sVar10 = strlen((char *)&fStack_fe8);
      pfStack_1240 = (fdb_iterator *)0x113dd7;
      sVar11 = strlen((char *)&fStack_ee8);
      pfStack_1240 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_11e8 + lVar17),auStack_1100 + 0x18,sVar7,&fStack_fe8,
                     sVar10,&fStack_ee8,sVar11);
      pfStack_1240 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_1230,*(fdb_doc **)(auStack_11e8 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 8;
    } while (uVar18 != 5);
    pfStack_1240 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\x01');
    uVar18 = 5;
    doc_03 = (fdb_doc **)(auStack_11e8 + 0x28);
    do {
      pfStack_1240 = (fdb_iterator *)0x113e52;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_fe8,"meta%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_ee8,"body%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113e92;
      sVar7 = strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x113e9d;
      sVar10 = strlen((char *)&fStack_fe8);
      pfStack_1240 = (fdb_iterator *)0x113ea8;
      sVar11 = strlen((char *)&fStack_ee8);
      pfStack_1240 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(doc_03,auStack_1100 + 0x18,sVar7,&fStack_fe8,sVar10,&fStack_ee8,sVar11);
      pfStack_1240 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_1230,*doc_03);
      uVar18 = uVar18 + 1;
      doc_03 = doc_03 + 1;
    } while (uVar18 != 9);
    pfVar12 = (fdb_kvs_handle *)(auStack_1100 + 0x18);
    pfStack_1240 = (fdb_iterator *)0x113f04;
    sprintf((char *)pfVar12,"key%d",9);
    config = &fStack_fe8;
    pfStack_1240 = (fdb_iterator *)0x113f22;
    sprintf((char *)config,"meta%d",9);
    pfVar13 = &fStack_ee8;
    pfStack_1240 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar13,"Body%d",9);
    pfVar9 = (fdb_kvs_handle *)(auStack_11e8 + 0x48);
    pfStack_1240 = (fdb_iterator *)0x113f50;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar12);
    pfStack_1240 = (fdb_iterator *)0x113f5b;
    doc_01 = (fdb_iterator *)strlen((char *)config);
    pfStack_1240 = (fdb_iterator *)0x113f66;
    sVar7 = strlen((char *)pfVar13);
    pfStack_1240 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar9,pfVar12,(size_t)pfVar8,config,(size_t)doc_01,pfVar13,sVar7);
    pfStack_1240 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_1230,(fdb_doc *)auStack_11e8._72_8_);
    pfStack_1240 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    **(undefined1 **)(auStack_11e8._72_8_ + 0x40) = 0x62;
    pfStack_1240 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_1230,(fdb_doc *)auStack_11e8._72_8_);
    pfStack_1240 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    pfStack_1200 = *(fdb_kvs_handle **)(auStack_11e8._72_8_ + 0x28);
    pfStack_1240 = (fdb_iterator *)0x113fdf;
    fVar4 = fdb_snapshot_open(pfStack_1230,&pfStack_11f0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_1240 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_1230,(fdb_doc *)auStack_11e8._72_8_);
    pfStack_1240 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    uVar18 = 10;
    pfVar9 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_1240 = (fdb_iterator *)0x11402c;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_fe8,"meta%d",uVar18 & 0xffffffff);
      pfVar13 = &fStack_ee8;
      pfStack_1240 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar13,"body%d",uVar18 & 0xffffffff);
      doc_01 = (fdb_iterator *)(auStack_11e8 + (long)pfVar9);
      pfStack_1240 = (fdb_iterator *)0x114074;
      pfVar12 = (fdb_kvs_handle *)strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x11407f;
      pfVar8 = (fdb_kvs_handle *)strlen((char *)&fStack_fe8);
      pfStack_1240 = (fdb_iterator *)0x11408a;
      sVar7 = strlen((char *)pfVar13);
      pfStack_1240 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_01,auStack_1100 + 0x18,(size_t)pfVar12,&fStack_fe8,
                     (size_t)pfVar8,pfVar13,sVar7);
      pfStack_1240 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_1230,*(fdb_doc **)(auStack_11e8 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      pfVar9 = (fdb_kvs_handle *)((long)pfVar9 + 8);
    } while (uVar18 != 0xf);
    pfStack_1240 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\x01');
    pfStack_1240 = (fdb_iterator *)0x1140f6;
    fVar4 = fdb_set_log_callback(pfStack_1230,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_1240 = (fdb_iterator *)0x114112;
    fVar4 = fdb_snapshot_open(pfStack_1230,(fdb_kvs_handle **)(auStack_1220 + 8),999999);
    pfVar12 = pfStack_1200;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_1240 = (fdb_iterator *)0x114132;
    fVar4 = fdb_snapshot_open(pfStack_1230,(fdb_kvs_handle **)(auStack_1220 + 8),
                              (fdb_seqnum_t)pfStack_1200);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_1240 = (fdb_iterator *)0x11414c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1220._8_8_,&pfStack_1208,
                              (fdb_seqnum_t)pfVar12);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_1240 = (fdb_iterator *)0x11415e;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_1220._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_1240 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_1208,(fdb_kvs_info *)(apfStack_1170 + 6));
    if ((fdb_kvs_handle *)fStack_1140.last_seqnum != pfVar12) {
      pfStack_1240 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar18 = 0xf;
    config = (fdb_iterator *)apfStack_1170;
    do {
      pfStack_1240 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      doc_01 = &fStack_fe8;
      pfStack_1240 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_01,"meta%d",uVar18 & 0xffffffff);
      pfVar12 = &fStack_ee8;
      pfStack_1240 = (fdb_iterator *)0x1141ef;
      sprintf((char *)pfVar12,"body%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x1141f7;
      pfVar13 = (fdb_kvs_handle *)strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x114202;
      pfVar8 = (fdb_kvs_handle *)strlen((char *)doc_01);
      pfStack_1240 = (fdb_iterator *)0x11420d;
      sVar7 = strlen((char *)pfVar12);
      pfStack_1240 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config,auStack_1100 + 0x18,(size_t)pfVar13,doc_01,(size_t)pfVar8,
                     pfVar12,sVar7);
      pfStack_1240 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_1230,*(fdb_doc **)config);
      uVar18 = uVar18 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar18 != 0x14);
    pfStack_1240 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    pfStack_1240 = (fdb_iterator *)0x11426d;
    fVar4 = fdb_snapshot_open(pfStack_11f0,&pfStack_11f8,0xffffffffffffffff);
    pfVar9 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar9 = (fdb_kvs_handle *)&pfStack_1228;
    pfStack_1240 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar9,
                   (void *)(*(size_t **)
                             (auStack_11e8 + (((long)pfStack_1200 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_11e8 + (((long)pfStack_1200 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_1240 = (fdb_iterator *)0x1142c5;
    fVar4 = fdb_get_metaonly(pfStack_1208,(fdb_doc *)pfStack_1228);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_1240 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_1228);
    pfStack_1240 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_1228,*(kvs_ops_stat **)(auStack_11e8._40_8_ + 0x20),
                   (size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_11e8._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_1240 = (fdb_iterator *)0x11430c;
    fVar4 = fdb_get_metaonly(pfStack_1208,(fdb_doc *)pfStack_1228);
    __s = (fdb_kvs_handle *)auStack_11e8._40_8_;
    doc_02 = pfStack_1228;
    pfVar9 = (fdb_kvs_handle *)&pfStack_1228;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    pfVar12 = (fdb_kvs_handle *)pfStack_1228->op_stats;
    config = *(fdb_iterator **)(auStack_11e8._40_8_ + 0x20);
    pfStack_1240 = (fdb_iterator *)0x114336;
    iVar5 = bcmp(pfVar12,config,(size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_11e8._40_8_);
    if (iVar5 != 0) goto LAB_001146d4;
    pfVar12 = (fdb_kvs_handle *)doc_02->staletree;
    config = *(fdb_iterator **)((long)__s + 0x38);
    pfStack_1240 = (fdb_iterator *)0x114357;
    iVar5 = bcmp(pfVar12,config,(size_t)(__s->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_001146df;
    pfStack_1240 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_02);
    pfStack_1240 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_1228,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_1228->fhandle = (fdb_file_handle *)0x6;
    pfStack_1240 = (fdb_iterator *)0x11439d;
    fVar4 = fdb_get_byseq(pfStack_1208,(fdb_doc *)pfStack_1228);
    pfVar9 = pfStack_1228;
    doc_02 = (fdb_kvs_handle *)&pfStack_1228;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    pfVar12 = (fdb_kvs_handle *)pfStack_1228->op_stats;
    config = *(fdb_iterator **)(auStack_11e8._40_8_ + 0x20);
    pfStack_1240 = (fdb_iterator *)0x1143c6;
    iVar5 = bcmp(pfVar12,config,*(size_t *)&pfStack_1228->kvs_config);
    __s = (fdb_kvs_handle *)auStack_11e8._40_8_;
    if (iVar5 != 0) goto LAB_001146ef;
    pfVar12 = (fdb_kvs_handle *)(pfVar9->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_11e8._40_8_ + 0x40))->
             seqtree;
    pfStack_1240 = (fdb_iterator *)0x1143e6;
    iVar5 = bcmp(pfVar12,config,(size_t)(pfVar9->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001146fa;
    pfStack_1240 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfVar9 = (fdb_kvs_handle *)&pfStack_1228;
    pfStack_1228 = (fdb_kvs_handle *)0x0;
    pfVar8 = (fdb_kvs_handle *)0x0;
    pfStack_1240 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_1208,(fdb_iterator **)auStack_1220,(void *)0x0,0,(void *)0x0,0,0);
    pfVar13 = pfVar12;
    do {
      pfStack_1240 = (fdb_iterator *)0x114432;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1220._0_8_,(fdb_doc **)pfVar9);
      pfVar12 = pfStack_1228;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_1240 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        pfVar12 = pfVar13;
LAB_0011465c:
        pfStack_1240 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_1240 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      config = (fdb_iterator *)pfStack_1228->op_stats;
      doc_01 = *(fdb_iterator **)(auStack_11e8 + (long)pfVar8 * 8);
      __s = (fdb_kvs_handle *)doc_01->_seqnum;
      pfStack_1240 = (fdb_iterator *)0x11445a;
      iVar5 = bcmp(config,__s,*(size_t *)&pfStack_1228->kvs_config);
      pfVar13 = pfVar12;
      if (iVar5 != 0) {
        pfStack_1240 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config = (fdb_iterator *)pfVar12->staletree;
      __s = (fdb_kvs_handle *)doc_01->tree_cursor_start;
      pfStack_1240 = (fdb_iterator *)0x114479;
      iVar5 = bcmp(config,__s,(size_t)(pfVar12->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_00114667;
      config = (fdb_iterator *)(pfVar12->field_6).seqtree;
      __s = (fdb_kvs_handle *)doc_01->tree_cursor_prev;
      pfStack_1240 = (fdb_iterator *)0x114498;
      iVar5 = bcmp(config,__s,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011465c;
      pfStack_1240 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)pfVar12);
      pfStack_1228 = (fdb_kvs_handle *)0x0;
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
      pfStack_1240 = (fdb_iterator *)0x1144be;
      pfVar16 = (fdb_iterator *)auStack_1220._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1220._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)pfVar8 == 10) {
      pfStack_1240 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_1220._0_8_);
      pfVar8 = (fdb_kvs_handle *)0x0;
      pfStack_1240 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_11f8,(fdb_iterator **)auStack_1220,(void *)0x0,0,(void *)0x0,0,0);
      pfVar9 = (fdb_kvs_handle *)&pfStack_1228;
      do {
        pfStack_1240 = (fdb_iterator *)0x114510;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1220._0_8_,(fdb_doc **)pfVar9);
        pfVar12 = pfStack_1228;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        config = (fdb_iterator *)pfStack_1228->op_stats;
        doc_01 = *(fdb_iterator **)(auStack_11e8 + (long)pfVar8 * 8);
        __s = (fdb_kvs_handle *)doc_01->_seqnum;
        pfStack_1240 = (fdb_iterator *)0x114538;
        iVar5 = bcmp(config,__s,*(size_t *)&pfStack_1228->kvs_config);
        if (iVar5 != 0) goto LAB_00114672;
        config = (fdb_iterator *)pfVar12->staletree;
        __s = (fdb_kvs_handle *)doc_01->tree_cursor_start;
        pfStack_1240 = (fdb_iterator *)0x114557;
        iVar5 = bcmp(config,__s,(size_t)(pfVar12->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_0011468d;
        config = (fdb_iterator *)(pfVar12->field_6).seqtree;
        __s = (fdb_kvs_handle *)doc_01->tree_cursor_prev;
        pfStack_1240 = (fdb_iterator *)0x114576;
        iVar5 = bcmp(config,__s,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00114682;
        pfStack_1240 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)pfVar12);
        pfStack_1228 = (fdb_kvs_handle *)0x0;
        pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
        pfStack_1240 = (fdb_iterator *)0x11459c;
        pfVar16 = (fdb_iterator *)auStack_1220._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1220._0_8_);
        pfVar13 = pfVar12;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)pfVar8 == 10) {
        pfStack_1240 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_1220._0_8_);
        pfStack_1240 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_1230);
        pfStack_1240 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_11f0);
        pfStack_1240 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_11f8);
        pfStack_1240 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_1208);
        pfStack_1240 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_1220._16_8_);
        lVar17 = 0;
        do {
          pfStack_1240 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_11e8 + lVar17 * 8));
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x14);
        pfStack_1240 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_1240 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pfStack_1240 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar14,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_1240 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_1240 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar13 = __s;
LAB_001146a2:
    pfStack_1240 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_1240 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_1240 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_1240 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_1240 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_1240 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_1240 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_1240 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_1240 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    __s = pfVar13;
    doc_02 = pfVar9;
    pfStack_1240 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_1240 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_1240 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar9 = doc_02;
    pfStack_1240 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_1240 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_1240 = (fdb_iterator *)0x114705;
    pfVar16 = config;
    snapshot_clone_test();
  }
  pfStack_1240 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_1240 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_1298 = (fdb_doc *)0x0;
  pfVar13 = pfVar16->handle;
  iVar5 = *(int *)&pfVar16->seqtree_iterator;
  pfStack_1268 = pfVar9;
  pfStack_1260 = __s;
  pfStack_1258 = pfVar8;
  pfStack_1250 = pfVar12;
  pfStack_1248 = config;
  pfStack_1240 = doc_01;
  gettimeofday(&tStack_1278,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar16->hbtrie_iterator,&pfStack_1280,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar17 = 0;
  iStack_1284 = iVar5;
  fdb_iterator_init(pfStack_1280,&pfStack_1290,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_1290,&pfStack_1298);
    doc_00 = pfStack_1298;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_1298->key;
    lVar2 = *(long *)(&(pfVar13->kvs_config).create_if_missing + lVar17 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_1298->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc_00->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc_00->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc_00);
    pfStack_1298 = (fdb_doc *)0x0;
    lVar17 = lVar17 + 1;
    fVar4 = fdb_iterator_next(pfStack_1290);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_1284 / 2 == (int)lVar17) {
    fdb_iterator_close(pfStack_1290);
    fdb_kvs_close(pfStack_1280);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void in_memory_snapshot_cleanup_test()
{
    TEST_INIT();

    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db1, *snap_db2, *snap_db3;
    fdb_kvs_handle *psnap_db1, *psnap_db2, *psnap_db3;
    fdb_doc *doc = NULL;
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[32];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_cleanup_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "key");
    sprintf(metabuf, "meta");
    sprintf(bodybuf, "body");
    fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_snapshot_open(db, &snap_db1, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &snap_db2, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(doc);

    // Update doc with new Key
    char newKey[32];
    sprintf(newKey, "Key");
    fdb_doc_create(&doc, (void*)newKey, strlen(newKey),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    status = fdb_snapshot_open(db, &snap_db3, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);

    status = fdb_get(snap_db1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db2, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db3, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(rdoc);

    status = fdb_snapshot_open(db, &psnap_db1, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db2, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db3, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close snapshot handle
    fdb_kvs_close(snap_db1);
    fdb_kvs_close(snap_db2);
    fdb_kvs_close(snap_db3);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(psnap_db1);
    fdb_kvs_close(psnap_db2);
    fdb_kvs_close(psnap_db3);

    // close db handle
    fdb_kvs_close(db);

    // close db file
    fdb_close(dbfile);

    fdb_doc_free(doc);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot cleanup test");
}